

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O3

bool deqp::gles31::Functional::ProgramInterfaceDefinition::isTypeIntegerOrContainsIntegers
               (VarType *varType)

{
  Type TVar1;
  DataType DVar2;
  pointer pSVar3;
  bool bVar4;
  VarType *varType_00;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  for (; TVar1 = varType->m_type, TVar1 == TYPE_ARRAY; varType = (varType->m_data).array.elementType
      ) {
  }
  if (TVar1 == TYPE_BASIC) {
    DVar2 = (varType->m_data).basic.type;
    bVar4 = true;
    if (3 < DVar2 - TYPE_INT) {
      bVar4 = DVar2 - TYPE_UINT < 4;
    }
  }
  else if (TVar1 == TYPE_STRUCT) {
    pSVar3 = (((varType->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (int)((long)(((varType->m_data).structPtr)->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) * -0x49249249
    ;
    if ((int)uVar5 < 1) {
      bVar4 = false;
    }
    else {
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
      varType_00 = &pSVar3->m_type;
      uVar7 = 0;
      do {
        bVar4 = isTypeIntegerOrContainsIntegers(varType_00);
        if (bVar4) goto LAB_01693d21;
        uVar7 = uVar7 + 1;
        varType_00 = (VarType *)&varType_00[2].m_data;
      } while (uVar6 != uVar7);
      bVar4 = uVar7 < uVar6;
    }
  }
  else {
LAB_01693d21:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

static bool isTypeIntegerOrContainsIntegers (const glu::VarType& varType)
{
	if (varType.isBasicType())
		return glu::isDataTypeIntOrIVec(varType.getBasicType()) || glu::isDataTypeUintOrUVec(varType.getBasicType());
	else if (varType.isArrayType())
		return isTypeIntegerOrContainsIntegers(varType.getElementType());
	else if (varType.isStructType())
	{
		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isTypeIntegerOrContainsIntegers(varType.getStructPtr()->getMember(ndx).getType()))
				return true;
		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}